

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opcodes_llvm_builtins.cpp
# Opt level: O1

bool dxil_spv::can_optimize_conditional_branch_to_static(Impl *impl,Value *value,bool *static_cond)

{
  uint uVar1;
  bool bVar2;
  ValueKind VVar3;
  Predicate PVar4;
  BinaryOps BVar5;
  CmpInst *this;
  Value *pVVar6;
  Constant *pCVar7;
  APInt *pAVar8;
  uint64_t uVar9;
  BinaryOperator *this_00;
  uint64_t uVar10;
  uint64_t uVar11;
  Constant *pCVar12;
  CmpInst *this_01;
  BinaryOperator *this_02;
  
  if (value == (Value *)0x0) {
    this_01 = (CmpInst *)0x0;
  }
  else {
    this = (CmpInst *)LLVMBC::Internal::resolve_proxy(value);
    VVar3 = LLVMBC::Value::get_value_kind((Value *)this);
    bVar2 = LLVMBC::CmpInst::is_base_of_value_kind(VVar3);
    this_01 = (CmpInst *)0x0;
    if (bVar2) {
      this_01 = this;
    }
  }
  if ((this_01 != (CmpInst *)0x0) &&
     (PVar4 = LLVMBC::CmpInst::getPredicate(this_01), PVar4 == ICMP_UGT)) {
    pVVar6 = LLVMBC::Instruction::getOperand(&this_01->super_Instruction,1);
    if (pVVar6 == (Value *)0x0) {
      pCVar12 = (Constant *)0x0;
    }
    else {
      pCVar7 = (Constant *)LLVMBC::Internal::resolve_proxy(pVVar6);
      VVar3 = LLVMBC::Value::get_value_kind((Value *)pCVar7);
      pCVar12 = (Constant *)0x0;
      if (VVar3 == ConstantInt) {
        pCVar12 = pCVar7;
      }
    }
    if (pCVar12 != (Constant *)0x0) {
      pAVar8 = LLVMBC::Constant::getUniqueInteger(pCVar12);
      uVar9 = LLVMBC::APInt::getZExtValue(pAVar8);
      pVVar6 = LLVMBC::Instruction::getOperand(&this_01->super_Instruction,0);
      this_02 = (BinaryOperator *)0x0;
      if (pVVar6 != (Value *)0x0) {
        this_00 = (BinaryOperator *)LLVMBC::Internal::resolve_proxy(pVVar6);
        VVar3 = LLVMBC::Value::get_value_kind((Value *)this_00);
        this_02 = (BinaryOperator *)0x0;
        if (VVar3 == BinaryOperator) {
          this_02 = this_00;
        }
      }
      if ((this_02 != (BinaryOperator *)0x0) &&
         (BVar5 = LLVMBC::BinaryOperator::getOpcode(this_02), BVar5 == UDiv)) {
        pVVar6 = LLVMBC::Instruction::getOperand(&this_02->super_Instruction,0);
        pCVar12 = (Constant *)0x0;
        if (pVVar6 != (Value *)0x0) {
          pCVar7 = (Constant *)LLVMBC::Internal::resolve_proxy(pVVar6);
          VVar3 = LLVMBC::Value::get_value_kind((Value *)pCVar7);
          pCVar12 = (Constant *)0x0;
          if (VVar3 == ConstantInt) {
            pCVar12 = pCVar7;
          }
        }
        if (pCVar12 != (Constant *)0x0) {
          pVVar6 = LLVMBC::Instruction::getOperand(&this_02->super_Instruction,1);
          bVar2 = value_is_dx_op_instrinsic(pVVar6,WaveGetLaneCount);
          if (bVar2) {
            pAVar8 = LLVMBC::Constant::getUniqueInteger(pCVar12);
            uVar10 = LLVMBC::APInt::getZExtValue(pAVar8);
            uVar1 = (impl->options).subgroup_size.implementation_minimum;
            pAVar8 = LLVMBC::Constant::getUniqueInteger(pCVar12);
            uVar11 = LLVMBC::APInt::getZExtValue(pAVar8);
            if (uVar9 < uVar11 / (impl->options).subgroup_size.implementation_maximum) {
              *static_cond = true;
              return true;
            }
            *static_cond = false;
            return uVar10 / uVar1 <= uVar9;
          }
        }
      }
    }
  }
  return false;
}

Assistant:

bool can_optimize_conditional_branch_to_static(
    Converter::Impl &impl, const llvm::Value *value, bool &static_cond)
{
	// Can be expanded as needed.
	// For now, search for common exhaustive loop unrolling patterns that DXC farts out.
	// Expect pattern of:
	// lower_bounded_expression > constant.
	// In the shader we've seen, we have: constant / WaveGetLaneCount(), which
	// we must narrow the bound of to avoid generating invalid code.
	const auto *comp_inst = llvm::dyn_cast<llvm::CmpInst>(value);
	if (!comp_inst)
		return false;

	if (comp_inst->getPredicate() != llvm::CmpInst::Predicate::ICMP_UGT)
		return false;

	const auto *rhs = llvm::dyn_cast<llvm::ConstantInt>(comp_inst->getOperand(1));
	if (!rhs)
		return false;

	uint64_t rhs_value = rhs->getUniqueInteger().getZExtValue();

	const auto *lhs = llvm::dyn_cast<llvm::BinaryOperator>(comp_inst->getOperand(0));
	if (!lhs)
		return false;

	if (lhs->getOpcode() != llvm::BinaryOperator::BinaryOps::UDiv)
		return false;

	const auto *num = llvm::dyn_cast<llvm::ConstantInt>(lhs->getOperand(0));
	if (!num)
		return false;
	if (!value_is_dx_op_instrinsic(lhs->getOperand(1), DXIL::Op::WaveGetLaneCount))
		return false;

	uint64_t upper_bound =
	    num->getUniqueInteger().getZExtValue() / impl.options.subgroup_size.implementation_minimum;
	uint64_t lower_bound =
		num->getUniqueInteger().getZExtValue() / impl.options.subgroup_size.implementation_maximum;

	if (lower_bound > rhs_value)
	{
		static_cond = true;
		return true;
	}
	else if (rhs_value >= upper_bound)
	{
		static_cond = false;
		return true;
	}
	else
	{
		static_cond = false;
		return false;
	}
}